

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype.cc
# Opt level: O2

void verona::merge(Bounds *lhs,Bounds *rhs)

{
  iterator iVar1;
  mapped_type *this;
  _Base_ptr p_Var2;
  
  for (p_Var2 = (rhs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(rhs->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2)) {
    iVar1 = std::
            _Rb_tree<trieste::Location,_std::pair<const_trieste::Location,_verona::Bound>,_std::_Select1st<std::pair<const_trieste::Location,_verona::Bound>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_verona::Bound>_>_>
            ::find(&lhs->_M_t,(key_type *)(p_Var2 + 1));
    if ((_Rb_tree_header *)iVar1._M_node == &(lhs->_M_t)._M_impl.super__Rb_tree_header) {
      this = std::
             map<trieste::Location,_verona::Bound,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_verona::Bound>_>_>
             ::operator[](lhs,(key_type *)(p_Var2 + 1));
      Bound::operator=(this,(Bound *)(p_Var2 + 2));
    }
    else {
      ::std::
      vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>::
      insert<__gnu_cxx::__normal_iterator<std::shared_ptr<verona::BtypeDef>*,std::vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>>,void>
                ((vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>
                  *)(iVar1._M_node + 2),(shared_ptr<verona::BtypeDef> *)iVar1._M_node[2]._M_parent,
                 *(shared_ptr<verona::BtypeDef> **)(p_Var2 + 2),
                 (shared_ptr<verona::BtypeDef> *)p_Var2[2]._M_parent);
      ::std::
      vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>::
      insert<__gnu_cxx::__normal_iterator<std::shared_ptr<verona::BtypeDef>*,std::vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>>,void>
                ((vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>
                  *)&iVar1._M_node[2]._M_right,*(shared_ptr<verona::BtypeDef> **)(iVar1._M_node + 3)
                 ,(shared_ptr<verona::BtypeDef> *)p_Var2[2]._M_right,
                 *(shared_ptr<verona::BtypeDef> **)(p_Var2 + 3));
    }
  }
  return;
}

Assistant:

void merge(Bounds& lhs, Bounds& rhs)
  {
    for (auto& [k, v] : rhs)
    {
      auto it = lhs.find(k);

      if (it == lhs.end())
      {
        lhs[k] = v;
      }
      else
      {
        // TODO: subsume bounds?
        it->second.lower.insert(
          it->second.lower.end(), v.lower.begin(), v.lower.end());
        it->second.upper.insert(
          it->second.upper.end(), v.upper.begin(), v.upper.end());
      }
    }
  }